

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresstype.cpp
# Opt level: O2

bool ExtractDestination(CScript *scriptPubKey,CTxDestination *addressRet)

{
  long lVar1;
  pointer puVar2;
  uchar *puVar3;
  undefined8 uVar4;
  TxoutType TVar5;
  size_t sVar6;
  bool bVar7;
  direct_or_indirect *this;
  long in_FS_OFFSET;
  Span<const_unsigned_char> vch;
  Span<const_unsigned_char> vch_00;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  vSolutions;
  direct_or_indirect local_b0 [2];
  CPubKey pubKey;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  vSolutions.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vSolutions.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vSolutions.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TVar5 = Solver(scriptPubKey,&vSolutions);
  uVar4 = pubKey.vch._0_8_;
  switch(TVar5) {
  case NONSTANDARD:
  case MULTISIG:
  case NULL_DATA:
    prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&pubKey,
               &scriptPubKey->super_CScriptBase);
    this = (direct_or_indirect *)&pubKey;
LAB_002b7374:
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::operator=((variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                 *)addressRet,(CNoDestination *)&this->indirect_contents);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&this->indirect_contents);
    goto LAB_002b752d;
  case ANCHOR:
    PayToAnchor::PayToAnchor((PayToAnchor *)&pubKey);
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::operator=((variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                 *)addressRet,(PayToAnchor *)&pubKey);
    goto LAB_002b754d;
  case PUBKEY:
    CPubKey::Set<unsigned_char_const*>
              (&pubKey,((vSolutions.
                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_start,
               ((vSolutions.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    if (((pubKey.vch[0] & 0xfe) != 2) &&
       ((7 < pubKey.vch[0] || ((0xd0U >> (pubKey.vch[0] & 0x1f) & 1) == 0)))) {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_b0[0].indirect_contents,
                 &scriptPubKey->super_CScriptBase);
      this = local_b0;
      goto LAB_002b7374;
    }
    memcpy(local_b0,&pubKey,0x41);
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::operator=((variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                 *)addressRet,(PubKeyDestination *)&local_b0[0].indirect_contents);
LAB_002b752d:
    bVar7 = false;
    goto LAB_002b7554;
  case PUBKEYHASH:
    puVar3 = ((vSolutions.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    vch.m_size = (long)((vSolutions.
                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar3;
    vch.m_data = puVar3;
    base_blob<160U>::base_blob((base_blob<160U> *)&local_b0[0].indirect_contents,vch);
    pubKey.vch[0x10] = local_b0[0]._16_1_;
    pubKey.vch[0x11] = local_b0[0]._17_1_;
    pubKey.vch[0x12] = local_b0[0]._18_1_;
    pubKey.vch[0x13] = local_b0[0]._19_1_;
    pubKey.vch._0_8_ = local_b0[0].indirect_contents.indirect;
    pubKey.vch[8] = local_b0[0]._8_1_;
    pubKey.vch[9] = local_b0[0]._9_1_;
    pubKey.vch[10] = local_b0[0]._10_1_;
    pubKey.vch[0xb] = local_b0[0]._11_1_;
    pubKey.vch[0xc] = local_b0[0]._12_1_;
    pubKey.vch[0xd] = local_b0[0]._13_1_;
    pubKey.vch[0xe] = local_b0[0]._14_1_;
    pubKey.vch[0xf] = local_b0[0]._15_1_;
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::operator=((variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                 *)addressRet,(PKHash *)&pubKey);
    break;
  case SCRIPTHASH:
    puVar3 = ((vSolutions.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    vch_00.m_size =
         (long)((vSolutions.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)puVar3;
    vch_00.m_data = puVar3;
    base_blob<160U>::base_blob((base_blob<160U> *)&local_b0[0].indirect_contents,vch_00);
    pubKey.vch[0x10] = local_b0[0]._16_1_;
    pubKey.vch[0x11] = local_b0[0]._17_1_;
    pubKey.vch[0x12] = local_b0[0]._18_1_;
    pubKey.vch[0x13] = local_b0[0]._19_1_;
    pubKey.vch._0_8_ = local_b0[0].indirect_contents.indirect;
    pubKey.vch[8] = local_b0[0]._8_1_;
    pubKey.vch[9] = local_b0[0]._9_1_;
    pubKey.vch[10] = local_b0[0]._10_1_;
    pubKey.vch[0xb] = local_b0[0]._11_1_;
    pubKey.vch[0xc] = local_b0[0]._12_1_;
    pubKey.vch[0xd] = local_b0[0]._13_1_;
    pubKey.vch[0xe] = local_b0[0]._14_1_;
    pubKey.vch[0xf] = local_b0[0]._15_1_;
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::operator=((variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                 *)addressRet,(ScriptHash *)&pubKey);
    break;
  case WITNESS_V0_SCRIPTHASH:
    pubKey.vch[0x10] = '\0';
    pubKey.vch[0x11] = '\0';
    pubKey.vch[0x12] = '\0';
    pubKey.vch[0x13] = '\0';
    pubKey.vch[0x14] = '\0';
    pubKey.vch[0x15] = '\0';
    pubKey.vch[0x16] = '\0';
    pubKey.vch[0x17] = '\0';
    pubKey.vch[0x18] = '\0';
    pubKey.vch[0x19] = '\0';
    pubKey.vch[0x1a] = '\0';
    pubKey.vch[0x1b] = '\0';
    pubKey.vch[0x1c] = '\0';
    pubKey.vch[0x1d] = '\0';
    pubKey.vch[0x1e] = '\0';
    pubKey.vch[0x1f] = '\0';
    pubKey.vch[0] = '\0';
    pubKey.vch[1] = '\0';
    pubKey.vch[2] = '\0';
    pubKey.vch[3] = '\0';
    pubKey.vch[4] = '\0';
    pubKey.vch[5] = '\0';
    pubKey.vch[6] = '\0';
    pubKey.vch[7] = '\0';
    pubKey.vch[8] = '\0';
    pubKey.vch[9] = '\0';
    pubKey.vch[10] = '\0';
    pubKey.vch[0xb] = '\0';
    pubKey.vch[0xc] = '\0';
    pubKey.vch[0xd] = '\0';
    pubKey.vch[0xe] = '\0';
    pubKey.vch[0xf] = '\0';
    puVar2 = ((vSolutions.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar6 = (long)((vSolutions.
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar2;
    if (sVar6 != 0) {
      memmove(&pubKey,puVar2,sVar6);
    }
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::operator=((variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                 *)addressRet,(WitnessV0ScriptHash *)&pubKey);
    break;
  case WITNESS_V0_KEYHASH:
    pubKey.vch[0] = '\0';
    pubKey.vch[1] = '\0';
    pubKey.vch[2] = '\0';
    pubKey.vch[3] = '\0';
    pubKey.vch[4] = '\0';
    pubKey.vch[5] = '\0';
    pubKey.vch[6] = '\0';
    pubKey.vch[7] = '\0';
    pubKey.vch[8] = '\0';
    pubKey.vch[9] = '\0';
    pubKey.vch[10] = '\0';
    pubKey.vch[0xb] = '\0';
    pubKey.vch[0xc] = '\0';
    pubKey.vch[0xd] = '\0';
    pubKey.vch[0xe] = '\0';
    pubKey.vch[0xf] = '\0';
    pubKey.vch._16_8_ = pubKey.vch._16_8_ & 0xffffffff00000000;
    puVar2 = ((vSolutions.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar6 = (long)((vSolutions.
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar2;
    if (sVar6 != 0) {
      memmove(&pubKey,puVar2,sVar6);
    }
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::operator=((variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                 *)addressRet,(WitnessV0KeyHash *)&pubKey);
    break;
  case WITNESS_V1_TAPROOT:
    pubKey.vch[0x10] = '\0';
    pubKey.vch[0x11] = '\0';
    pubKey.vch[0x12] = '\0';
    pubKey.vch[0x13] = '\0';
    pubKey.vch[0x14] = '\0';
    pubKey.vch[0x15] = '\0';
    pubKey.vch[0x16] = '\0';
    pubKey.vch[0x17] = '\0';
    pubKey.vch[0x18] = '\0';
    pubKey.vch[0x19] = '\0';
    pubKey.vch[0x1a] = '\0';
    pubKey.vch[0x1b] = '\0';
    pubKey.vch[0x1c] = '\0';
    pubKey.vch[0x1d] = '\0';
    pubKey.vch[0x1e] = '\0';
    pubKey.vch[0x1f] = '\0';
    pubKey.vch[0] = '\0';
    pubKey.vch[1] = '\0';
    pubKey.vch[2] = '\0';
    pubKey.vch[3] = '\0';
    pubKey.vch[4] = '\0';
    pubKey.vch[5] = '\0';
    pubKey.vch[6] = '\0';
    pubKey.vch[7] = '\0';
    pubKey.vch[8] = '\0';
    pubKey.vch[9] = '\0';
    pubKey.vch[10] = '\0';
    pubKey.vch[0xb] = '\0';
    pubKey.vch[0xc] = '\0';
    pubKey.vch[0xd] = '\0';
    pubKey.vch[0xe] = '\0';
    pubKey.vch[0xf] = '\0';
    puVar2 = ((vSolutions.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar6 = (long)((vSolutions.
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar2;
    if (sVar6 != 0) {
      memmove(&pubKey,puVar2,sVar6);
    }
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::operator=((variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                 *)addressRet,(WitnessV1Taproot *)&pubKey);
    break;
  case WITNESS_UNKNOWN:
    pubKey.vch[1] = '\0';
    pubKey.vch[2] = '\0';
    pubKey.vch[3] = '\0';
    pubKey.vch[0] =
         *((vSolutions.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start;
    pubKey.vch._4_4_ = SUB84(uVar4,4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(pubKey.vch + 8),
               vSolutions.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1);
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::operator=((variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                 *)addressRet,(WitnessUnknown *)&pubKey);
LAB_002b754d:
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)(pubKey.vch + 8));
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addresstype.cpp"
                  ,0x68,"bool ExtractDestination(const CScript &, CTxDestination &)");
  }
  bVar7 = true;
LAB_002b7554:
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&vSolutions);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool ExtractDestination(const CScript& scriptPubKey, CTxDestination& addressRet)
{
    std::vector<valtype> vSolutions;
    TxoutType whichType = Solver(scriptPubKey, vSolutions);

    switch (whichType) {
    case TxoutType::PUBKEY: {
        CPubKey pubKey(vSolutions[0]);
        if (!pubKey.IsValid()) {
            addressRet = CNoDestination(scriptPubKey);
        } else {
            addressRet = PubKeyDestination(pubKey);
        }
        return false;
    }
    case TxoutType::PUBKEYHASH: {
        addressRet = PKHash(uint160(vSolutions[0]));
        return true;
    }
    case TxoutType::SCRIPTHASH: {
        addressRet = ScriptHash(uint160(vSolutions[0]));
        return true;
    }
    case TxoutType::WITNESS_V0_KEYHASH: {
        WitnessV0KeyHash hash;
        std::copy(vSolutions[0].begin(), vSolutions[0].end(), hash.begin());
        addressRet = hash;
        return true;
    }
    case TxoutType::WITNESS_V0_SCRIPTHASH: {
        WitnessV0ScriptHash hash;
        std::copy(vSolutions[0].begin(), vSolutions[0].end(), hash.begin());
        addressRet = hash;
        return true;
    }
    case TxoutType::WITNESS_V1_TAPROOT: {
        WitnessV1Taproot tap;
        std::copy(vSolutions[0].begin(), vSolutions[0].end(), tap.begin());
        addressRet = tap;
        return true;
    }
    case TxoutType::ANCHOR: {
        addressRet = PayToAnchor();
        return true;
    }
    case TxoutType::WITNESS_UNKNOWN: {
        addressRet = WitnessUnknown{vSolutions[0][0], vSolutions[1]};
        return true;
    }
    case TxoutType::MULTISIG:
    case TxoutType::NULL_DATA:
    case TxoutType::NONSTANDARD:
        addressRet = CNoDestination(scriptPubKey);
        return false;
    } // no default case, so the compiler can warn about missing cases
    assert(false);
}